

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O1

Abc_Cex_t *
Bmc_CexCareBits(Gia_Man_t *p,Abc_Cex_t *pCexState,Abc_Cex_t *pCexImpl,Abc_Cex_t *pCexEss,
               int fFindAll,int fVerbose)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  bool bVar3;
  Abc_Cex_t *pCex;
  Vec_Int_t *pVVar4;
  sbyte sVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  char *__format;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  int local_54;
  
  if (pCexState->nRegs != 0) {
    __assert_fail("pCexState->nRegs == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                  ,0x22c,
                  "Abc_Cex_t *Bmc_CexCareBits(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t *, Abc_Cex_t *, int, int)"
                 );
  }
  pCex = Abc_CexAlloc(0,p->vCis->nSize,pCexState->iFrame + 1);
  pCex->iFrame = pCexState->iFrame;
  pCex->iPo = pCexState->iPo;
  Gia_ManCleanMark01(p);
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xffffffffbfffffff;
  *(ulong *)p->pObjs = *(ulong *)p->pObjs | 0x4000000000000000;
  iVar1 = pCexState->iFrame;
  if (-1 < iVar1) {
    local_54 = iVar1 + 1;
    do {
      pVVar4 = p->vCis;
      if (0 < pVVar4->nSize) {
        iVar7 = pCexState->nPis;
        lVar9 = 0;
        do {
          iVar11 = pVVar4->pArray[lVar9];
          if (((long)iVar11 < 0) || (p->nObjs <= iVar11)) goto LAB_0057e117;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          uVar6 = iVar7 * iVar1 + (int)lVar9;
          iVar13 = (int)uVar6 >> 5;
          uVar6 = uVar6 & 0x1f;
          sVar5 = (sbyte)uVar6;
          pGVar2 = p->pObjs + iVar11;
          uVar16 = *(ulong *)pGVar2 & 0xbfffffffbfffffff |
                   (ulong)(((uint)(&pCexState[1].iPo)[iVar13] >> sVar5 & 1) << 0x1e);
          *(ulong *)pGVar2 = uVar16;
          if (pCexImpl != (Abc_Cex_t *)0x0) {
            *(ulong *)pGVar2 =
                 (ulong)(((uint)(&pCexImpl[1].iPo)[iVar13] >> uVar6 & 1) != 0) << 0x3e | uVar16;
          }
          if (pCexEss != (Abc_Cex_t *)0x0) {
            *(ulong *)pGVar2 =
                 *(ulong *)pGVar2 & 0xbfffffffffffffff |
                 (ulong)(((uint)(*(ulong *)pGVar2 >> 0x3e) |
                         (uint)(&pCexEss[1].iPo)[iVar13] >> sVar5) & 1) << 0x3e;
          }
          lVar9 = lVar9 + 1;
          pVVar4 = p->vCis;
        } while (lVar9 < pVVar4->nSize);
      }
      if (0 < p->nObjs) {
        lVar9 = 0;
        lVar8 = 0;
        do {
          pGVar2 = p->pObjs;
          if (pGVar2 == (Gia_Obj_t *)0x0) break;
          uVar16 = *(ulong *)(&pGVar2->field_0x0 + lVar9);
          uVar6 = (uint)uVar16;
          if ((uVar16 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar6) {
            uVar15 = (uint)(uVar16 >> 0x1d) & 7 ^
                     *(uint *)((long)pGVar2 +
                              (ulong)(uint)((int)(uVar16 & 0x1fffffff) << 2) * -3 + lVar9) >> 0x1e;
            uVar14 = (uint)(uVar16 >> 0x1e);
            uVar17 = *(uint *)((long)pGVar2 + (ulong)(uVar14 & 0x7ffffffc) * -3 + lVar9) >> 0x1e & 1
            ;
            uVar18 = (uint)(uVar16 >> 0x3d) & 1;
            uVar10 = (uVar17 ^ uVar18) & uVar15;
            uVar12 = (ulong)(uVar10 << 0x1e);
            *(ulong *)(&pGVar2->field_0x0 + lVar9) = uVar16 & 0xffffffff3fffffff | uVar12;
            if (uVar10 == 0) {
              if (((uVar15 & 1) == 0) && (uVar17 == uVar18)) {
                uVar16 = uVar16 & 0xbfffffff3fffffff |
                         (*(ulong *)((long)pGVar2 + lVar9 + (ulong)(uVar14 & 0x7ffffffc) * -3) |
                         *(ulong *)((long)pGVar2 + lVar9 + (ulong)((uVar6 & 0x1fffffff) << 2) * -3))
                         & 0x4000000000000000;
              }
              else if ((uVar15 & 1) == 0) {
                uVar16 = uVar16 & 0xbfffffff3fffffff |
                         *(ulong *)((long)pGVar2 + lVar9 + (ulong)((uVar6 & 0x1fffffff) << 2) * -3)
                         & 0x4000000000000000;
              }
              else {
                if (uVar17 != uVar18) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                                ,0x250,
                                "Abc_Cex_t *Bmc_CexCareBits(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t *, Abc_Cex_t *, int, int)"
                               );
                }
                uVar16 = uVar16 & 0xbfffffff3fffffff |
                         *(ulong *)((long)pGVar2 + lVar9 + (ulong)(uVar14 & 0x7ffffffc) * -3) &
                         0x4000000000000000;
              }
            }
            else {
              uVar16 = uVar16 & 0xbfffffff3fffffff | uVar12 |
                       *(ulong *)((long)pGVar2 + lVar9 + (ulong)((uVar6 & 0x1fffffff) << 2) * -3) &
                       0x4000000000000000 &
                       *(ulong *)((long)pGVar2 + lVar9 + (ulong)(uVar14 & 0x7ffffffc) * -3);
            }
            *(ulong *)(&pGVar2->field_0x0 + lVar9) = uVar16;
          }
          lVar8 = lVar8 + 1;
          lVar9 = lVar9 + 0xc;
        } while (lVar8 < p->nObjs);
      }
      pVVar4 = p->vCos;
      uVar6 = pVVar4->nSize;
      uVar16 = (ulong)uVar6;
      if (0 < (int)uVar6) {
        lVar9 = 0;
        do {
          uVar6 = (uint)uVar16;
          iVar7 = pVVar4->pArray[lVar9];
          if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_0057e117;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar2 = p->pObjs + iVar7;
          uVar6 = (uint)*(ulong *)pGVar2;
          *(ulong *)pGVar2 =
               *(ulong *)pGVar2 & 0xffffffffbfffffff |
               (ulong)((uVar6 * 2 ^ *(uint *)(pGVar2 + -(ulong)(uVar6 & 0x1fffffff))) & 0x40000000);
          lVar9 = lVar9 + 1;
          pVVar4 = p->vCos;
          uVar6 = pVVar4->nSize;
          uVar16 = (ulong)(int)uVar6;
        } while (lVar9 < (long)uVar16);
      }
      if (iVar1 == pCexState->iFrame) {
        uVar10 = pCexState->iPo;
        if ((int)(uVar6 - p->nRegs) <= (int)uVar10) {
          __assert_fail("v < Gia_ManPoNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
        }
        if (((int)uVar10 < 0) || ((int)uVar6 <= (int)uVar10)) {
LAB_0057e136:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        lVar9 = (long)pVVar4->pArray[uVar10];
        if ((lVar9 < 0) || (p->nObjs <= pVVar4->pArray[uVar10])) {
LAB_0057e117:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        uVar6 = (uint)*(undefined8 *)(p->pObjs + lVar9);
        if ((uVar6 >> 0x1e & 1) == 0) {
          __assert_fail("Gia_ManPo(p, pCexState->iPo)->fMark0 == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                        ,599,
                        "Abc_Cex_t *Bmc_CexCareBits(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t *, Abc_Cex_t *, int, int)"
                       );
        }
        pGVar2 = p->pObjs + (lVar9 - (ulong)(uVar6 & 0x1fffffff));
        if (fFindAll == 0) {
          Bmc_CexCareBits2_rec(p,pGVar2);
        }
        else {
          Bmc_CexCareBits_rec(p,pGVar2);
        }
      }
      else {
        iVar7 = p->nRegs;
        if (0 < iVar7) {
          iVar11 = 0;
          do {
            iVar13 = p->vCos->nSize;
            uVar6 = (iVar13 - iVar7) + iVar11;
            if (((int)uVar6 < 0) || (iVar13 <= (int)uVar6)) goto LAB_0057e136;
            iVar13 = p->vCos->pArray[uVar6];
            if (((long)iVar13 < 0) || (p->nObjs <= iVar13)) goto LAB_0057e117;
            if (p->pObjs == (Gia_Obj_t *)0x0) break;
            uVar6 = ((pCex->nPis * local_54 + p->vCis->nSize) - iVar7) + iVar11;
            if (((uint)(&pCex[1].iPo)[(int)uVar6 >> 5] >> (uVar6 & 0x1f) & 1) != 0) {
              pGVar2 = p->pObjs + iVar13;
              if (fFindAll == 0) {
                Bmc_CexCareBits2_rec(p,pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff));
              }
              else {
                Bmc_CexCareBits_rec(p,pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff));
              }
            }
            iVar11 = iVar11 + 1;
            iVar7 = p->nRegs;
          } while (iVar11 < iVar7);
        }
      }
      pVVar4 = p->vCis;
      if (0 < pVVar4->nSize) {
        lVar9 = 0;
        do {
          iVar7 = pVVar4->pArray[lVar9];
          if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_0057e117;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar2 = p->pObjs + iVar7;
          uVar16 = *(ulong *)pGVar2;
          if ((uVar16 & 0x4000000000000000) != 0) {
            *(ulong *)pGVar2 = uVar16 & 0xbfffffffffffffff;
            if ((pCexImpl == (Abc_Cex_t *)0x0) ||
               (uVar6 = pCex->nPis * iVar1 + (int)lVar9,
               ((uint)(&pCexImpl[1].iPo)[(int)uVar6 >> 5] >> (uVar6 & 0x1f) & 1) == 0)) {
              iVar7 = pCex->nPis * iVar1 + (int)lVar9;
              (&pCex[1].iPo)[iVar7 >> 5] = (&pCex[1].iPo)[iVar7 >> 5] | 1 << ((byte)iVar7 & 0x1f);
            }
          }
          lVar9 = lVar9 + 1;
          pVVar4 = p->vCis;
        } while (lVar9 < pVVar4->nSize);
      }
      local_54 = local_54 + -1;
      bVar3 = 0 < iVar1;
      iVar1 = iVar1 + -1;
    } while (bVar3);
  }
  __format = "Minimized:    ";
  if (pCexEss == (Abc_Cex_t *)0x0) {
    __format = "Care bits:    ";
  }
  printf(__format);
  Bmc_CexPrint(pCex,p->vCis->nSize - p->nRegs,fVerbose);
  return pCex;
}

Assistant:

Abc_Cex_t * Bmc_CexCareBits( Gia_Man_t * p, Abc_Cex_t * pCexState, Abc_Cex_t * pCexImpl, Abc_Cex_t * pCexEss, int fFindAll, int fVerbose )
{
    Abc_Cex_t * pNew;
    Gia_Obj_t * pObj;
    int fCompl0, fCompl1;
    int i, k, iBit;
    assert( pCexState->nRegs == 0 );
    // start the counter-example
    pNew = Abc_CexAlloc( 0, Gia_ManCiNum(p), pCexState->iFrame + 1 );
    pNew->iFrame = pCexState->iFrame;
    pNew->iPo    = pCexState->iPo;
    // set initial state
    Gia_ManCleanMark01(p);
    // set const0
    Gia_ManConst0(p)->fMark0 = 0;
    Gia_ManConst0(p)->fMark1 = 1;
    for ( i = pCexState->iFrame; i >= 0; i-- )
    {
        // set correct values
        iBit = pCexState->nPis * i;
        Gia_ManForEachCi( p, pObj, k )
        {
            pObj->fMark0 = Abc_InfoHasBit(pCexState->pData, iBit+k);
            pObj->fMark1 = 0;
            if ( pCexImpl )
                pObj->fMark1 |= Abc_InfoHasBit(pCexImpl->pData, iBit+k);
            if ( pCexEss )
                pObj->fMark1 |= Abc_InfoHasBit(pCexEss->pData, iBit+k);
        }
        Gia_ManForEachAnd( p, pObj, k )
        {
            fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
            pObj->fMark0 = fCompl0 & fCompl1;
            if ( pObj->fMark0 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1 & Gia_ObjFanin1(pObj)->fMark1;
            else if ( !fCompl0 && !fCompl1 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1 | Gia_ObjFanin1(pObj)->fMark1;
            else if ( !fCompl0 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1;
            else if ( !fCompl1 )
                pObj->fMark1 = Gia_ObjFanin1(pObj)->fMark1;
            else assert( 0 );
        }
        Gia_ManForEachCo( p, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
        // move values from COs to CIs
        if ( i == pCexState->iFrame )
        {
            assert( Gia_ManPo(p, pCexState->iPo)->fMark0 == 1 );
            if ( fFindAll )
                Bmc_CexCareBits_rec( p, Gia_ObjFanin0(Gia_ManPo(p, pCexState->iPo)) );
            else
                Bmc_CexCareBits2_rec( p, Gia_ObjFanin0(Gia_ManPo(p, pCexState->iPo)) );
        }
        else
        {
            Gia_ManForEachRi( p, pObj, k )
                if ( Abc_InfoHasBit(pNew->pData, pNew->nPis * (i+1) + Gia_ManPiNum(p) + k) )
                {
                     if ( fFindAll )
                         Bmc_CexCareBits_rec( p, Gia_ObjFanin0(pObj) );
                     else
                         Bmc_CexCareBits2_rec( p, Gia_ObjFanin0(pObj) );
                }
        }
        // save the results
        Gia_ManForEachCi( p, pObj, k )
            if ( pObj->fMark1 )
            {
                pObj->fMark1 = 0;
                if ( pCexImpl == NULL || !Abc_InfoHasBit(pCexImpl->pData, pNew->nPis * i + k) )
                    Abc_InfoSetBit(pNew->pData, pNew->nPis * i + k);
            }
    }
    if ( pCexEss )
        printf( "Minimized:    " );
    else
        printf( "Care bits:    " );
    Bmc_CexPrint( pNew, Gia_ManPiNum(p), fVerbose );
    return pNew;
}